

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O3

void __thiscall
TPZTensor<TFad<6,_double>_>::TPZDecomposed::ComputeJ3(TPZDecomposed *this,TFad<6,_double> *J3)

{
  TFad<6,_double> *pTVar1;
  value_type vVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  long lVar8;
  int i;
  TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>
  local_260;
  TFad<6,_double> local_250;
  TFad<6,_double> local_210;
  undefined8 local_1c8;
  double adStack_1c0 [8];
  double local_180 [8];
  double local_140 [8];
  double local_100 [6];
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> local_d0;
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
  local_c0;
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> local_b0;
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
  local_a0;
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> local_90;
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
  local_80;
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>
  local_70;
  TFad<6,_double> local_60;
  
  local_d0.fadexpr_.left_ = &local_60;
  local_210.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_01835938;
  local_210.dx_[0] = 0.0;
  local_210.dx_[1] = 0.0;
  local_210.dx_[2] = 0.0;
  local_210.dx_[3] = 0.0;
  local_210.dx_[4] = 0.0;
  local_210.dx_[5] = 0.0;
  local_250.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_01835938;
  local_250.dx_[0] = 0.0;
  local_250.dx_[1] = 0.0;
  local_250.dx_[2] = 0.0;
  local_250.dx_[3] = 0.0;
  local_250.dx_[4] = 0.0;
  local_250.dx_[5] = 0.0;
  local_60.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_01835938;
  local_60.dx_[0] = 0.0;
  local_60.dx_[1] = 0.0;
  local_60.dx_[2] = 0.0;
  local_60.dx_[3] = 0.0;
  local_60.dx_[4] = 0.0;
  local_60.dx_[5] = 0.0;
  adStack_1c0[5] = 0.0;
  adStack_1c0[3] = 0.0;
  adStack_1c0[4] = 0.0;
  adStack_1c0[1] = 0.0;
  adStack_1c0[2] = 0.0;
  local_1c8 = 0;
  adStack_1c0[0] = 0.0;
  pTVar1 = (this->fEigenvalues).super_TPZVec<TFad<6,_double>_>.fStore;
  local_100[4] = pTVar1->dx_[4];
  local_100[5] = pTVar1->dx_[5];
  local_100[2] = pTVar1->dx_[2];
  local_100[3] = pTVar1->dx_[3];
  local_100[0] = pTVar1->dx_[0];
  local_100[1] = pTVar1->dx_[1];
  local_210.val_ = pTVar1->val_;
  local_140[0] = pTVar1[1].dx_[0];
  local_140[1] = pTVar1[1].dx_[1];
  local_140[2] = pTVar1[1].dx_[2];
  local_140[3] = pTVar1[1].dx_[3];
  local_140[4] = pTVar1[1].dx_[4];
  local_140[5] = pTVar1[1].dx_[5];
  local_250.val_ = pTVar1[1].val_;
  local_180[4] = pTVar1[2].dx_[4];
  local_180[5] = pTVar1[2].dx_[5];
  local_180[2] = pTVar1[2].dx_[2];
  local_180[3] = pTVar1[2].dx_[3];
  local_180[0] = pTVar1[2].dx_[0];
  local_180[1] = pTVar1[2].dx_[1];
  local_60.val_ = pTVar1[2].val_;
  lVar8 = 2;
  do {
    dVar3 = adStack_1c0[lVar8 + 0x17];
    dVar4 = adStack_1c0[lVar8 + 0xf];
    dVar5 = adStack_1c0[lVar8 + 7];
    local_210.dx_[lVar8 + -2] =
         (adStack_1c0[lVar8 + 6] + adStack_1c0[lVar8 + 0xe] + adStack_1c0[lVar8 + 0x16]) *
         -0.3333333333333333 + adStack_1c0[lVar8 + 0x16];
    local_210.dx_[lVar8 + -1] = (dVar5 + dVar4 + dVar3) * -0.3333333333333333 + dVar3;
    lVar8 = lVar8 + 2;
  } while (lVar8 != 8);
  dVar3 = (local_210.val_ + local_250.val_ + local_60.val_) * 0.3333333333333333;
  local_210.val_ = local_210.val_ - dVar3;
  lVar8 = 2;
  do {
    dVar4 = adStack_1c0[lVar8 + 0xf];
    dVar5 = adStack_1c0[lVar8 + 0x17];
    dVar6 = adStack_1c0[lVar8 + 7];
    local_250.dx_[lVar8 + -2] =
         (adStack_1c0[lVar8 + 6] + adStack_1c0[lVar8 + 0x16] + adStack_1c0[lVar8 + 0xe]) *
         -0.3333333333333333 + adStack_1c0[lVar8 + 0xe];
    local_250.dx_[lVar8 + -1] = (dVar6 + dVar5 + dVar4) * -0.3333333333333333 + dVar4;
    lVar8 = lVar8 + 2;
  } while (lVar8 != 8);
  local_250.val_ = local_250.val_ - dVar3;
  lVar8 = 0;
  do {
    dVar4 = *(double *)((long)adStack_1c0 + lVar8 + 0x40);
    dVar5 = *(double *)((long)adStack_1c0 + lVar8 + 0x48);
    dVar6 = *(double *)((long)adStack_1c0 + lVar8 + 200);
    dVar7 = *(double *)((long)adStack_1c0 + lVar8 + 0x88);
    *(double *)((long)local_60.dx_ + lVar8) =
         (*(double *)((long)adStack_1c0 + lVar8 + 0x80) +
          *(double *)((long)adStack_1c0 + lVar8 + 0xc0) + dVar4) * -0.3333333333333333 + dVar4;
    *(double *)((long)local_60.dx_ + lVar8 + 8) =
         (dVar7 + dVar6 + dVar5) * -0.3333333333333333 + dVar5;
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x30);
  local_60.val_ = local_60.val_ - dVar3;
  local_90.fadexpr_.left_ = &local_210;
  local_80.fadexpr_.left_ = &local_90;
  local_70.fadexpr_.left_ = &local_80;
  local_b0.fadexpr_.left_ = &local_250;
  local_a0.fadexpr_.left_ = &local_b0;
  local_70.fadexpr_.right_ = &local_a0;
  local_260.left_ = &local_70;
  local_c0.fadexpr_.left_ = &local_d0;
  local_260.right_ = &local_c0;
  lVar8 = 0;
  local_d0.fadexpr_.right_ = local_d0.fadexpr_.left_;
  local_c0.fadexpr_.right_ = local_d0.fadexpr_.left_;
  local_b0.fadexpr_.right_ = local_b0.fadexpr_.left_;
  local_a0.fadexpr_.right_ = local_b0.fadexpr_.left_;
  local_90.fadexpr_.right_ = local_90.fadexpr_.left_;
  local_80.fadexpr_.right_ = local_90.fadexpr_.left_;
  do {
    vVar2 = TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>
            ::dx(&local_260,(int)lVar8);
    adStack_1c0[lVar8] = vVar2 * 0.3333333333333333;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 6);
  vVar2 = TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>
          ::val(&local_260);
  J3->dx_[4] = adStack_1c0[4];
  J3->dx_[5] = adStack_1c0[5];
  J3->dx_[2] = adStack_1c0[2];
  J3->dx_[3] = adStack_1c0[3];
  J3->dx_[0] = adStack_1c0[0];
  J3->dx_[1] = adStack_1c0[1];
  J3->val_ = vVar2 * 0.3333333333333333;
  return;
}

Assistant:

void ComputeJ3(T & J3) {
            T sig1, sig2, sig3, s1, s2, s3, temp;
            sig1 = this->fEigenvalues[0];
            sig2 = this->fEigenvalues[1];
            sig3 = this->fEigenvalues[2];
            s1 = sig1 - (1. / 3.)*(sig1 + sig2 + sig3);
            s2 = sig2 - (1. / 3.)*(sig1 + sig2 + sig3);
            s3 = sig3 - (1. / 3.)*(sig1 + sig2 + sig3);
            temp = (1. / 3.)*(s1 * s1 * s1 + s2 * s2 * s2 + s3 * s3 * s3);
            J3 = temp;
        }